

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O0

bool chatter::platform::SocketSetOption(Socket socket,SocketOption option,int value)

{
  long local_28;
  timeval timeVal;
  int result;
  int value_local;
  SocketOption option_local;
  Socket socket_local;
  
  timeVal.tv_usec._4_4_ = value;
  switch(option) {
  case NONBLOCK:
    timeVal.tv_usec._0_4_ = ioctl(socket,0x5421,(undefined1 *)((long)&timeVal.tv_usec + 4));
    break;
  case BROADCAST:
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,6,(void *)((long)&timeVal.tv_usec + 4),4);
    break;
  case REUSEADDR:
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,2,(void *)((long)&timeVal.tv_usec + 4),4);
    break;
  case RCVBUF:
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,8,(void *)((long)&timeVal.tv_usec + 4),4);
    break;
  case SNDBUF:
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,7,(void *)((long)&timeVal.tv_usec + 4),4);
    break;
  case RCVTIMEO:
    local_28 = (long)(value / 1000);
    timeVal.tv_sec = (__time_t)((value % 1000) * 1000);
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x14,&local_28,0x10);
    break;
  case SNDTIMEO:
    local_28 = (long)(value / 1000);
    timeVal.tv_sec = (__time_t)((value % 1000) * 1000);
    timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x15,&local_28,0x10);
  }
  return (bool)(-((int)timeVal.tv_usec == 0) & 1);
}

Assistant:

bool SocketSetOption(Socket socket, SocketOption option, int value)
{
    int result;
    struct timeval timeVal;

    switch (option) {
        case SocketOption::NONBLOCK:
            result = ioctl(socket, FIONBIO, &value);
            break;

        case SocketOption::BROADCAST:
            result = setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (char*)&value, sizeof(int));
            break;

        case SocketOption::REUSEADDR:
            result = setsockopt(socket, SOL_SOCKET, SO_REUSEADDR, (char*)&value, sizeof(int));
            break;

        case SocketOption::RCVBUF:
            result = setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&value, sizeof(int));
            break;

        case SocketOption::SNDBUF:
            result = setsockopt(socket, SOL_SOCKET, SO_SNDBUF, (char*)&value, sizeof(int));
            break;

        case SocketOption::RCVTIMEO:
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt(socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&timeVal, sizeof(struct timeval));
            break;

        case SocketOption::SNDTIMEO:
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt(socket, SOL_SOCKET, SO_SNDTIMEO, (char*)&timeVal, sizeof(struct timeval));
            break;

#if 0
        case SocketOption::NODELAY:
            result = setsockopt(socket, IPPROTO_TCP, TCP_NODELAY, (char*)&value, sizeof(int));
            break;
#endif
    }
    return result == 0 ? true : false;
}